

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O1

void __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::insert
          (ClassArray<soplex::Nonzero<double>_> *this,int i,int n)

{
  int iVar1;
  Nonzero<double> *pNVar2;
  long lVar3;
  long lVar4;
  
  if (0 < n) {
    iVar1 = this->thesize;
    lVar4 = (long)iVar1;
    reSize(this,iVar1 + n);
    if (i < iVar1) {
      lVar3 = lVar4 << 4;
      do {
        lVar4 = lVar4 + -1;
        pNVar2 = this->data;
        *(undefined4 *)((long)&pNVar2[(ulong)(uint)n - 1].idx + lVar3) =
             *(undefined4 *)(lVar3 + -8 + (long)pNVar2);
        *(undefined8 *)((long)&pNVar2[(ulong)(uint)n - 1].val + lVar3) =
             *(undefined8 *)((long)&pNVar2[-1].val + lVar3);
        lVar3 = lVar3 + -0x10;
      } while (i < lVar4);
    }
  }
  return;
}

Assistant:

void insert(int i, int n)
   {
      assert(n >= 0);
      assert(i >= 0);
      assert(i <= thesize);

      if(n > 0)
      {
         int j = thesize;

         reSize(thesize + n);
         assert(thesize == j + n);

         /// move \p n elements in memory from insert position \p i to the back
         while(j > i)
         {
            j--;
            data[j + n] = data[j];
         }
      }
   }